

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_attribute.c
# Opt level: O0

value attribute_metadata_visibility(attribute_conflict attr)

{
  value *ppvVar1;
  value pvVar2;
  value visibility;
  value *visibility_array;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  char *local_8;
  
  local_8 = (char *)value_create_array(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    ppvVar1 = value_to_array((value)0x10809c);
    pvVar2 = value_create_string(local_8,in_stack_ffffffffffffffd8);
    *ppvVar1 = pvVar2;
    if (*ppvVar1 == (value)0x0) {
      value_type_destroy(in_stack_00000050);
      local_8 = (char *)0x0;
    }
    else {
      pvVar2 = class_visibility_value(VISIBILITY_PUBLIC);
      ppvVar1[1] = pvVar2;
      if (ppvVar1[1] == (value)0x0) {
        value_type_destroy(in_stack_00000050);
        local_8 = (char *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

value attribute_metadata_visibility(attribute attr)
{
	static const char visibility_str[] = "visibility";
	value *visibility_array, visibility = value_create_array(NULL, 2);

	if (visibility == NULL)
	{
		return NULL;
	}

	visibility_array = value_to_array(visibility);
	visibility_array[0] = value_create_string(visibility_str, sizeof(visibility_str) - 1);

	if (visibility_array[0] == NULL)
	{
		value_type_destroy(visibility);
		return NULL;
	}

	visibility_array[1] = class_visibility_value(attr->visibility);

	if (visibility_array[1] == NULL)
	{
		value_type_destroy(visibility);
		return NULL;
	}

	return visibility;
}